

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

unsigned_long *
StringBuilder<char,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (char *arg,char (*args) [2],unsigned_long *args_1,char (*args_2) [2],char *args_3,
          char (*args_4) [2],unsigned_long *args_5,char (*args_6) [2],char *args_7,
          char (*args_8) [2])

{
  char (*in_RCX) [2];
  char (*unaff_RBX) [2];
  unsigned_long *in_RDI;
  unsigned_long *in_R8;
  char (*in_R9) [2];
  char *unaff_retaddr;
  char (*in_stack_00000008) [2];
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_58 [16];
  char (*in_stack_ffffffffffffffb8) [2];
  char *in_stack_ffffffffffffffc0;
  unsigned_long *args_4_00;
  
  args_4_00 = in_RDI;
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff78);
  StringBuilder<char[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,args_4_00,
             unaff_RBX,unaff_retaddr,in_stack_00000008);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}